

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_ws.hpp
# Opt level: O2

void __thiscall
SimpleWeb::
SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>
::start(SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>
        *this,function<void_()> *callback)

{
  shared_ptr<asio::io_context> *this_00;
  bool bVar1;
  element_type *this_01;
  __shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  std::mutex::lock(&this->start_stop_mutex);
  this_00 = &this->io_service;
  this_01 = (this->io_service).super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  if (this_01 == (element_type *)0x0) {
    std::make_shared<asio::io_context>();
    std::__shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&this_00->super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>,&local_30)
    ;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
    this->internal_io_service = true;
    this_01 = (this->io_service).super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  }
  bVar1 = asio::io_context::stopped(this_01);
  if (bVar1) {
    restart((this_00->super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  }
  (*this->_vptr_SocketClientBase[2])(this);
  if ((callback->super__Function_base)._M_manager != (_Manager_type)0x0) {
    post<std::function<void()>>
              ((this_00->super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
               callback);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->start_stop_mutex);
  if (this->internal_io_service == true) {
    asio::io_context::run
              ((this_00->super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  }
  return;
}

Assistant:

void start(std::function<void()> callback = nullptr) {
      {
        std::lock_guard<std::mutex> lock(start_stop_mutex);

        if(!io_service) {
          io_service = std::make_shared<io_context>();
          internal_io_service = true;
        }

        if(io_service->stopped())
          restart(*io_service);

        connect();

        if(callback)
          post(*io_service, std::move(callback));
      }

      if(internal_io_service)
        io_service->run();
    }